

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O0

int Bdc_SpfdMark1(Bdc_Ent_t *p,Bdc_Ent_t *pEnt)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  Bdc_Ent_t *pEnt_local;
  Bdc_Ent_t *p_local;
  
  if (((uint)*(undefined8 *)pEnt & 0x1fffffff) == 0x1fffffff) {
    p_local._4_4_ = 0;
  }
  else if (*(long *)pEnt < 0) {
    p_local._4_4_ = 0;
  }
  else {
    *(ulong *)pEnt = *(ulong *)pEnt & 0x7fffffffffffffff | 0x8000000000000000;
    uVar1 = *(ulong *)pEnt;
    iVar2 = Bdc_SpfdMark1(p,p + (int)((uint)*(undefined8 *)pEnt & 0x1fffffff));
    iVar3 = Bdc_SpfdMark1(p,p + (int)((uint)((ulong)*(undefined8 *)pEnt >> 0x20) & 0x1fffffff));
    p_local._4_4_ = ((uint)(uVar1 >> 0x1f) & 1) + iVar2 + iVar3;
  }
  return p_local._4_4_;
}

Assistant:

int Bdc_SpfdMark1( Bdc_Ent_t * p, Bdc_Ent_t * pEnt )
{
    if ( pEnt->iFan0 == BDC_TERM )
        return 0;
    if ( pEnt->fMark1 )
        return 0;
    pEnt->fMark1 = 1;
    return pEnt->fMark0 + 
        Bdc_SpfdMark1(p, p + pEnt->iFan0) + 
        Bdc_SpfdMark1(p, p + pEnt->iFan1);
}